

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<4ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                *matcher_tuple,tuple<int,_int,_int,_int,_int,_int,_int> *value_tuple)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_20;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    local_20.stream_ = (ostream *)0x0;
    local_20._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001912a8;
    bVar1 = MatcherBase<int>::MatchAndExplain
                      ((MatcherBase<int> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                        .
                        super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                        .
                        super__Tuple_impl<3UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                        .super__Head_base<3UL,_testing::Matcher<int>,_false>,
                       &(value_tuple->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int>.
                        super__Tuple_impl<2UL,_int,_int,_int,_int,_int>.
                        super__Tuple_impl<3UL,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>
                        ._M_head_impl,&local_20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }